

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O2

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder2<std::function<void(std::error_code_const&,unsigned_long)>,std::error_code,unsigned_long>>
          (any_executor_base *this,
          binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
          *f)

{
  _func_void_any_executor_base_ptr_function_view *UNRECOVERED_JUMPTABLE;
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  non_const_lvalue<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>_>
  f2;
  function_view fVar2;
  bad_executor ex;
  allocator<void> local_59;
  executor_function local_58;
  binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
  local_50;
  
  if (this->target_ == (void *)0x0) {
    local_58.impl_ = (impl_base *)&PTR__exception_004c1598;
    asio::detail::throw_exception<asio::execution::bad_executor>((bad_executor *)&local_58);
    std::exception::~exception((exception *)&local_58);
  }
  else {
    UNRECOVERED_JUMPTABLE = this->target_fns_->blocking_execute;
    if (UNRECOVERED_JUMPTABLE != (_func_void_any_executor_base_ptr_function_view *)0x0) {
      fVar2.function_ = f;
      fVar2.complete_ =
           asio::detail::executor_function_view::
           complete<asio::detail::binder2<std::function<void(std::error_code_const&,unsigned_long)>,std::error_code,unsigned_long>>
      ;
      (*UNRECOVERED_JUMPTABLE)(this,fVar2);
      return;
    }
    p_Var1 = this->target_fns_->execute;
    asio::detail::
    binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
    ::binder2(&local_50,f);
    asio::detail::executor_function::
    executor_function<asio::detail::binder2<std::function<void(std::error_code_const&,unsigned_long)>,std::error_code,unsigned_long>,std::allocator<void>>
              (&local_58,&local_50,&local_59);
    (*p_Var1)(this,&local_58);
    asio::detail::executor_function::~executor_function(&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
  }
  return;
}

Assistant:

void execute(F&& f) const
  {
    if (target_)
    {
      if (target_fns_->blocking_execute != 0)
      {
        asio::detail::non_const_lvalue<F> f2(f);
        target_fns_->blocking_execute(*this, function_view(f2.value));
      }
      else
      {
        target_fns_->execute(*this,
            function(static_cast<F&&>(f), std::allocator<void>()));
      }
    }
    else
    {
      bad_executor ex;
      asio::detail::throw_exception(ex);
    }
  }